

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmMakefileTargetGenerator::GetFlags
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *l)

{
  char *pcVar1;
  cmGeneratorTarget *target;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmTarget *pcVar3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_00;
  int iVar4;
  iterator iVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar6;
  value_type entry;
  string flags;
  allocator local_a1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  string local_60;
  string *local_40;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_38;
  
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->FlagsByLanguage)._M_t,l);
  if ((_Rb_tree_header *)iVar5._M_node ==
      &(this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    pcVar1 = (l->_M_dataplus)._M_p;
    local_38 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->FlagsByLanguage;
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    AddFeatureFlags(this,&local_60,&local_a0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    target = this->GeneratorTarget;
    pcVar2 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    local_40 = &this->ConfigName;
    cmLocalGenerator::AddArchitectureFlags
              (&pcVar2->super_cmLocalGenerator,&local_60,target,&local_a0.first,local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    iVar4 = std::__cxx11::string::compare((char *)l);
    if (iVar4 == 0) {
      AddFortranFlags(this,&local_60);
    }
    pcVar3 = this->Target;
    pcVar2 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    cmLocalGenerator::AddCMP0018Flags
              (&pcVar2->super_cmLocalGenerator,&local_60,pcVar3,&local_a0.first,local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = this->Target;
    pcVar2 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    cmLocalGenerator::AddVisibilityPresetFlags
              (&pcVar2->super_cmLocalGenerator,&local_60,pcVar3,&local_a0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    AddIncludeFlags(this,&local_60,&local_a0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
              (this->LocalGenerator,&local_60,(this->Makefile->DefineFlags)._M_dataplus._M_p);
    pcVar2 = this->LocalGenerator;
    GetFrameworkFlags(&local_a0.first,this,l);
    (*(pcVar2->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])(pcVar2,&local_60,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = this->Target;
    pcVar2 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    cmLocalGenerator::AddCompileOptions
              (&pcVar2->super_cmLocalGenerator,&local_60,pcVar3,&local_a0.first,local_40);
    this_00 = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_a0,l,&local_60);
    pVar6 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
                      (this_00,&local_a0);
    iVar5._M_node = (_Base_ptr)pVar6.first._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.second._M_dataplus._M_p != &local_a0.second.field_2) {
      operator_delete(local_a0.second._M_dataplus._M_p,
                      local_a0.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(iVar5._M_node + 2),
             (long)&(iVar5._M_node[2]._M_parent)->_M_color + *(long *)(iVar5._M_node + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetFlags(const std::string &l)
{
  ByLanguageMap::iterator i = this->FlagsByLanguage.find(l);
  if (i == this->FlagsByLanguage.end())
    {
    std::string flags;
    const char *lang = l.c_str();

    // Add language feature flags.
    this->AddFeatureFlags(flags, lang);

    this->LocalGenerator->AddArchitectureFlags(flags, this->GeneratorTarget,
                                               lang, this->ConfigName);

    // Fortran-specific flags computed for this target.
    if(l == "Fortran")
      {
      this->AddFortranFlags(flags);
      }

    this->LocalGenerator->AddCMP0018Flags(flags, this->Target,
                                          lang, this->ConfigName);

    this->LocalGenerator->AddVisibilityPresetFlags(flags, this->Target,
                                                   lang);

    // Add include directory flags.
    this->AddIncludeFlags(flags, lang);

    // Append old-style preprocessor definition flags.
    this->LocalGenerator->
      AppendFlags(flags, this->Makefile->GetDefineFlags());

    // Add include directory flags.
    this->LocalGenerator->
      AppendFlags(flags,this->GetFrameworkFlags(l));

    // Add target-specific flags.
    this->LocalGenerator->AddCompileOptions(flags, this->Target,
                                            lang, this->ConfigName);

    ByLanguageMap::value_type entry(l, flags);
    i = this->FlagsByLanguage.insert(entry).first;
    }
  return i->second;
}